

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  mtree *mtree;
  bool bVar2;
  __mode_t p;
  uint uVar3;
  uint uVar4;
  mode_t mVar5;
  int iVar6;
  mtree_entry *pmVar7;
  int *piVar8;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar9;
  archive_string *paVar10;
  size_t sVar11;
  mtree_entry **ppmVar12;
  archive_rb_node *paVar13;
  archive_rb_node *paVar14;
  size_t len;
  mtree_entry *pmVar15;
  long lVar16;
  la_int64_t lVar17;
  char *pcVar18;
  char *pcVar19;
  size_t sVar20;
  mtree_entry *__s_00;
  char *pcVar21;
  ulong uVar22;
  __dev_t _Var23;
  long lVar24;
  char cVar25;
  byte *pbVar26;
  long lVar27;
  undefined1 *puVar28;
  mtree_entry *pmVar29;
  ulong uVar30;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  long local_118;
  archive_entry *local_110;
  uint local_104;
  mtree_entry *local_100;
  mtree_entry *local_f8;
  mtree_entry *local_f0;
  mtree_entry *local_e8;
  archive_rb_tree *local_e0;
  archive_entry *local_d8;
  archive_entry *local_d0;
  mtree_entry **local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      uVar22 = 0xffffffe2;
      goto LAB_0045c649;
    }
    local_d8 = entry;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    local_110 = (archive_entry *)0x0;
    detect_form(a,(int *)&local_d0);
    local_118 = 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = &mtree->entries;
      local_e0 = &mtree->rbtree;
      local_f8 = (mtree_entry *)0x0;
LAB_0045be8c:
      lVar27 = 0;
      uVar30 = 0;
      do {
        _Var23 = local_c0.st_dev;
        if ((long)local_c0.st_dev < 0) goto LAB_0045c639;
        pvVar9 = memchr(__s,10,local_c0.st_dev);
        if (pvVar9 != (void *)0x0) {
          _Var23 = (long)pvVar9 + (1 - (long)__s);
          local_c0.st_dev = _Var23;
        }
        if (0xffff < (long)(_Var23 + uVar30)) {
          pcVar18 = "Line too long";
          iVar6 = 0x54;
          goto LAB_0045c632;
        }
        paVar10 = archive_string_ensure((archive_string *)mtree,_Var23 + uVar30 + 1);
        if (paVar10 == (archive_string *)0x0) {
          pcVar18 = "Can\'t allocate working buffer";
          iVar6 = 0xc;
          goto LAB_0045c632;
        }
        memcpy((mtree->line).s + uVar30,__s,local_c0.st_dev);
        __archive_read_consume(a,local_c0.st_dev);
        _Var23 = local_c0.st_dev;
        uVar22 = local_c0.st_dev + uVar30;
        (mtree->line).s[uVar22] = '\0';
        pmVar7 = (mtree_entry *)(mtree->line).s;
        pbVar26 = (byte *)((long)(pmVar7->rbnode).rb_nodes + lVar27);
LAB_0045bf26:
        bVar1 = *pbVar26;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar9 == (void *)0x0) goto LAB_0045bf6e;
          }
          else {
            if (bVar1 == 0) goto LAB_0045bf6e;
            if (bVar1 == 10) {
              if (uVar22 == 0) break;
              if (-1 < (long)uVar22) {
                lVar27 = 0;
                pmVar29 = pmVar7;
                goto LAB_0045bfb9;
              }
              free_options((mtree_option *)local_110);
              entry = local_d8;
              if ((int)uVar22 != 0) goto LAB_0045c649;
              goto LAB_0045ba21;
            }
          }
LAB_0045bf5c:
          pbVar26 = pbVar26 + 1;
          goto LAB_0045bf26;
        }
        if ((bVar1 != 0x5c) || (pbVar26[1] == 0)) goto LAB_0045bf5c;
        if (pbVar26[1] != 10) {
          pbVar26 = pbVar26 + 1;
          goto LAB_0045bf5c;
        }
        *(char *)((long)(pmVar7->rbnode).rb_nodes + (uVar22 - 2)) = '\0';
        uVar22 = uVar22 - 2;
        pmVar7 = (mtree_entry *)(mtree->line).s;
LAB_0045bf6e:
        lVar27 = (long)pbVar26 - (long)pmVar7;
        __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
        uVar30 = uVar22;
      } while (__s != (void *)0x0);
    }
LAB_0045c46d:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_110);
    entry = local_d8;
  }
LAB_0045ba21:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar7 = mtree->this_entry;
  uVar22 = 1;
  if (pmVar7 != (mtree_entry *)0x0) {
    paVar10 = &mtree->current_dir;
    local_100 = (mtree_entry *)&mtree->rbtree;
    do {
      pcVar18 = pmVar7->name;
      if (((*pcVar18 == '.') && (pcVar18[1] == '.')) && (pcVar18[2] == '\0')) {
        pmVar7->used = '\x01';
        sVar20 = (mtree->current_dir).length;
        if (sVar20 != 0) {
          pcVar18 = paVar10->s;
          pcVar19 = pcVar18 + sVar20;
          do {
            pcVar21 = pcVar19;
            pcVar19 = pcVar21 + -1;
            if (pcVar19 < pcVar18) break;
          } while (*pcVar19 != '/');
          pcVar21 = pcVar21 + -2;
          if (pcVar19 < pcVar18) {
            pcVar21 = pcVar19;
          }
          (mtree->current_dir).length = (size_t)(pcVar21 + (1 - (long)pcVar18));
        }
      }
      else if (pmVar7->used == '\0') {
        pmVar7->used = '\x01';
        local_110 = entry;
        archive_entry_set_filetype(entry,0x8000);
        archive_entry_set_size(entry,0);
        (mtree->contents_name).length = 0;
        local_104 = 0;
        uVar3 = parse_line(a,entry,mtree,pmVar7,(int *)&local_104);
        if (pmVar7->full == '\0') {
          sVar20 = (mtree->current_dir).length;
          if (sVar20 != 0) {
            archive_strcat(paVar10,"/");
          }
          archive_strcat(paVar10,pmVar7->name);
          archive_entry_copy_pathname(entry,paVar10->s);
          mVar5 = archive_entry_filetype(entry);
          if (mVar5 != 0x4000) {
            (mtree->current_dir).length = sVar20;
          }
        }
        else {
          archive_entry_copy_pathname(entry,pmVar7->name);
          for (pmVar7 = (mtree_entry *)
                        __archive_rb_tree_find_node((archive_rb_tree *)local_100,pmVar7->name);
              pmVar7 != (mtree_entry *)0x0; pmVar7 = pmVar7->next_dup) {
            if ((pmVar7->full != '\0') && (pmVar7->used == '\0')) {
              pmVar7->used = '\x01';
              uVar4 = parse_line(a,entry,mtree,pmVar7,(int *)&local_104);
              if ((int)uVar4 < (int)uVar3) {
                uVar3 = uVar4;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_0045c5c1:
          lVar17 = archive_entry_size(entry);
          mtree->cur_size = lVar17;
          mtree->offset = 0;
        }
        else {
          mtree->fd = -1;
          if ((mtree->contents_name).length == 0) {
            pcVar18 = archive_entry_pathname(entry);
          }
          else {
            pcVar18 = (mtree->contents_name).s;
          }
          mVar5 = archive_entry_filetype(entry);
          if ((mVar5 == 0x8000) || (mVar5 = archive_entry_filetype(entry), mVar5 == 0x4000)) {
            iVar6 = open(pcVar18,0x80000);
            mtree->fd = iVar6;
            __archive_ensure_cloexec_flag(iVar6);
            iVar6 = mtree->fd;
            if (iVar6 == -1) {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar8,"Can\'t open %s",pcVar18);
                uVar3 = 0xffffffec;
              }
              goto LAB_0045bc29;
            }
          }
          else {
LAB_0045bc29:
            iVar6 = mtree->fd;
          }
          if (iVar6 < 0) {
            iVar6 = lstat(pcVar18,&local_c0);
            if (iVar6 != -1) goto LAB_0045bc82;
LAB_0045bcba:
            if ((local_104 & 0x800) == 0) goto LAB_0045c5c1;
LAB_0045bdd7:
            pmVar7 = mtree->this_entry;
            goto LAB_0045bde0;
          }
          iVar6 = fstat(iVar6,&local_c0);
          if (iVar6 == -1) {
            piVar8 = __errno_location();
            archive_set_error(&a->archive,*piVar8,"Could not fstat %s",pcVar18);
            close(mtree->fd);
            mtree->fd = -1;
            uVar3 = 0xffffffec;
            goto LAB_0045bcba;
          }
LAB_0045bc82:
          p = local_c0.st_mode;
          uVar4 = local_c0.st_mode & 0xf000;
          if (uVar4 == 0xa000) {
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 != 0xa000) goto LAB_0045bd25;
LAB_0045c48e:
            uVar4 = local_104;
            if (((local_104 & 0x1001) != 1) &&
               ((mVar5 = archive_entry_filetype(entry), mVar5 == 0x2000 ||
                (mVar5 = archive_entry_filetype(entry), mVar5 == 0x6000)))) {
              archive_entry_set_rdev(entry,local_c0.st_rdev);
            }
            if ((uVar4 & 0xc) == 0 || (uVar4 >> 0xc & 1) != 0) {
              archive_entry_set_gid(entry,(ulong)local_c0.st_gid);
            }
            if ((uVar4 & 0x600) == 0 || (uVar4 >> 0xc & 1) != 0) {
              archive_entry_set_uid(entry,(ulong)local_c0.st_uid);
            }
            if ((uVar4 & 0x1010) != 0x10) {
              archive_entry_set_mtime(entry,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
            }
            if ((uVar4 & 0x1020) != 0x20) {
              archive_entry_set_nlink(entry,(uint)local_c0.st_nlink);
            }
            if ((uVar4 & 0x1040) != 0x40) {
              archive_entry_set_perm(entry,p);
            }
            if ((uVar4 & 0x1080) != 0x80) {
              archive_entry_set_size(entry,local_c0.st_size);
            }
            archive_entry_set_ino(entry,local_c0.st_ino);
            archive_entry_set_dev(entry,local_c0.st_dev);
            archive_entry_linkify(mtree->resolver,&local_110,&local_d0);
            entry = local_110;
            goto LAB_0045c5c1;
          }
          if ((uVar4 == 0x8000) && (mVar5 = archive_entry_filetype(entry), mVar5 == 0x8000))
          goto LAB_0045c48e;
LAB_0045bd25:
          if (((~p & 0xc000) == 0) && (mVar5 = archive_entry_filetype(entry), mVar5 == 0xc000))
          goto LAB_0045c48e;
          switch(uVar4 - 0x1000 >> 0xc) {
          case 0:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x1000) goto LAB_0045c48e;
            break;
          case 1:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x2000) goto LAB_0045c48e;
            break;
          case 3:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x4000) goto LAB_0045c48e;
            break;
          case 5:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x6000) goto LAB_0045c48e;
          }
          if (-1 < mtree->fd) {
            close(mtree->fd);
          }
          mtree->fd = -1;
          if ((local_104 & 0x800) != 0) goto LAB_0045bdd7;
          if (uVar3 == 0) {
            pcVar18 = archive_entry_pathname(entry);
            archive_set_error(&a->archive,-1,"mtree specification has different type for %s",pcVar18
                             );
            uVar3 = 0xffffffec;
          }
        }
        uVar22 = (ulong)uVar3;
        break;
      }
LAB_0045bde0:
      uVar22 = 1;
      pmVar7 = pmVar7->next;
      mtree->this_entry = pmVar7;
    } while (pmVar7 != (mtree_entry *)0x0);
  }
LAB_0045c649:
  return (int)uVar22;
LAB_0045bfb9:
  pmVar29 = (mtree_entry *)((long)(pmVar29->rbnode).rb_nodes + 1);
  uVar22 = (ulong)*(byte *)((long)(pmVar7->rbnode).rb_nodes + lVar27);
  if (0x2f < uVar22) goto LAB_0045c163;
  if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar22 & 0x3f) & 1) != 0) goto LAB_0045bfec;
    if (uVar22 == 0x2f) {
      uVar22 = (local_c0.st_dev + uVar30) - lVar27;
      if (4 < (long)uVar22) {
        pcVar18 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar27);
        iVar6 = strncmp(pcVar18,"/set",4);
        if (iVar6 == 0) {
          cVar25 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 4);
          if ((cVar25 == ' ') || (cVar25 == '\t')) {
            pcVar18 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 4);
            goto LAB_0045c246;
          }
        }
        else if (((6 < uVar22) && (iVar6 = strncmp(pcVar18,"/unset",6), iVar6 == 0)) &&
                ((cVar25 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 6), cVar25 == ' ' ||
                 (cVar25 == '\t')))) {
          pcVar19 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 6);
          pcVar18 = strchr(pcVar19,0x3d);
          if (pcVar18 != (char *)0x0) {
            pcVar18 = "/unset shall not contain `=\'";
            iVar6 = -1;
            goto LAB_0045c632;
          }
          sVar11 = strspn(pcVar19," \t\r\n");
          cVar25 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + 6 + sVar11);
          if (cVar25 == '\0') goto LAB_0045bfec;
          pcVar18 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar27 + sVar11 + 6);
          goto LAB_0045c0e6;
        }
      }
      archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_118);
      goto LAB_0045c639;
    }
    goto LAB_0045c163;
  }
  lVar27 = lVar27 + 1;
  goto LAB_0045bfb9;
LAB_0045c246:
  sVar11 = strspn(pcVar18," \t\r\n");
  if (pcVar18[sVar11] == '\0') goto LAB_0045bfec;
  pcVar21 = pcVar18 + sVar11;
  sVar11 = strcspn(pcVar21," \t\r\n");
  pcVar18 = pcVar21 + sVar11;
  pcVar19 = strchr(pcVar21,0x3d);
  sVar20 = (long)pcVar19 - (long)pcVar21;
  if (pcVar18 < pcVar19) {
    sVar20 = sVar11;
  }
  remove_option((mtree_option **)&local_110,pcVar21,sVar20);
  uVar3 = add_option(a,(mtree_option **)&local_110,pcVar21,sVar11);
  if (uVar3 != 0) goto LAB_0045c609;
  goto LAB_0045c246;
LAB_0045c0e6:
  do {
    sVar11 = strcspn(pcVar18," \t\r\n");
    sVar20 = sVar11;
    if (sVar11 == 3) {
      if (((cVar25 != 'a') || (pcVar18[1] != 'l')) || (pcVar18[2] != 'l')) {
        sVar20 = 3;
        goto LAB_0045c13f;
      }
      free_options((mtree_option *)local_110);
      local_110 = (archive_entry *)0x0;
    }
    else {
LAB_0045c13f:
      remove_option((mtree_option **)&local_110,pcVar18,sVar20);
    }
    pcVar18 = pcVar18 + sVar11;
    sVar11 = strspn(pcVar18," \t\r\n");
    cVar25 = pcVar18[sVar11];
    pcVar18 = pcVar18 + sVar11;
  } while (cVar25 != '\0');
  goto LAB_0045bfec;
LAB_0045c163:
  local_f0 = (mtree_entry *)CONCAT44(local_f0._4_4_,(uint32_t)local_d0);
  local_100 = (mtree_entry *)malloc(0x40);
  if (local_100 != (mtree_entry *)0x0) {
    __s_00 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + lVar27);
    lVar24 = (_Var23 + uVar30) - lVar27;
    *(undefined8 *)((long)&local_100->options + 2) = 0;
    *(undefined8 *)((long)&local_100->name + 2) = 0;
    local_100->next = (mtree_entry *)0x0;
    local_100->options = (mtree_option *)0x0;
    ppmVar12 = &local_f8->next;
    if (local_f8 == (mtree_entry *)0x0) {
      ppmVar12 = local_c8;
    }
    *ppmVar12 = local_100;
    local_e8 = local_100;
    if ((int)local_f0 != 0) {
      pmVar15 = __s_00;
      if (0 < lVar24) {
        pbVar26 = (byte *)((long)(pmVar7->rbnode).rb_nodes + _Var23 + uVar30);
LAB_0045c1e1:
        pbVar26 = pbVar26 + -1;
        if (((ulong)*pbVar26 < 0x21) && ((0x100002600U >> ((ulong)*pbVar26 & 0x3f) & 1) != 0))
        goto code_r0x0045c1f8;
        lVar16 = 0;
        do {
          if (((ulong)(byte)pmVar29[-1].field_0x3f < 0x21) &&
             ((0x100002600U >> ((ulong)(byte)pmVar29[-1].field_0x3f & 0x3f) & 1) != 0)) {
            pmVar15 = pmVar29;
          }
          lVar16 = lVar16 + 1;
          pmVar29 = (mtree_entry *)((long)(pmVar29->rbnode).rb_nodes + 1);
        } while (lVar24 != lVar16);
      }
      goto LAB_0045c20e;
    }
    local_f0 = __s_00;
    pcVar18 = (char *)strcspn((char *)__s_00," \t\r\n");
    __s_00 = (mtree_entry *)(pcVar18 + (long)((long)(pmVar7->rbnode).rb_nodes + lVar27));
    pmVar15 = (mtree_entry *)(lVar24 + (long)__s_00);
    goto LAB_0045c2da;
  }
  goto LAB_0045c699;
code_r0x0045c1f8:
  bVar2 = lVar24 < 2;
  lVar24 = lVar24 + -1;
  if (bVar2) goto code_r0x0045c208;
  goto LAB_0045c1e1;
code_r0x0045c208:
  lVar24 = 0;
LAB_0045c20e:
  pcVar18 = (char *)((long)pmVar7 + lVar27 + (lVar24 - (long)pmVar15));
  local_f0 = pmVar15;
LAB_0045c2da:
  pmVar7 = local_e8;
  pcVar19 = (char *)malloc((size_t)(pcVar18 + 1));
  pmVar7->name = pcVar19;
  if (pcVar19 != (char *)0x0) {
    local_f8 = pmVar15;
    memcpy(pcVar19,local_f0,(size_t)pcVar18);
    pcVar19[(long)pcVar18] = '\0';
    parse_escapes(pcVar19,pmVar7);
    pmVar29 = local_100;
    pmVar7->next_dup = (mtree_entry *)0x0;
    if ((pmVar7->full != '\0') &&
       (iVar6 = __archive_rb_tree_insert_node(local_e0,&pmVar7->rbnode), iVar6 == 0)) {
      paVar13 = __archive_rb_tree_find_node(local_e0,pmVar7->name);
      do {
        paVar14 = paVar13;
        paVar13 = paVar14[1].rb_nodes[0];
      } while (paVar13 != (archive_rb_node *)0x0);
      paVar14[1].rb_nodes[0] = &pmVar7->rbnode;
    }
    puVar28 = (undefined1 *)&local_110;
    while (puVar28 = *(undefined1 **)puVar28, pmVar7 = (mtree_entry *)&pmVar29->options,
          puVar28 != (undefined1 *)0x0) {
      pcVar18 = *(char **)((long)puVar28 + 8);
      sVar11 = strlen(pcVar18);
      uVar3 = add_option(a,&pmVar29->options,pcVar18,sVar11);
      if (uVar3 != 0) goto LAB_0045c609;
    }
    while ((local_100 = pmVar7, sVar11 = strspn((char *)__s_00," \t\r\n"),
           *(char *)((long)(__s_00->rbnode).rb_nodes + sVar11) != '\0' &&
           (pmVar7 = (mtree_entry *)((long)(__s_00->rbnode).rb_nodes + sVar11), pmVar7 < local_f8)))
    {
      len = strcspn((char *)pmVar7," \t\r\n");
      __s_00 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + len);
      pmVar15 = (mtree_entry *)strchr((char *)pmVar7,0x3d);
      pmVar29 = local_100;
      sVar11 = (long)pmVar15 - (long)pmVar7;
      if (__s_00 < pmVar15) {
        sVar11 = len;
      }
      if (pmVar15 == (mtree_entry *)0x0) {
        sVar11 = len;
      }
      remove_option((mtree_option **)local_100,(char *)pmVar7,sVar11);
      uVar3 = add_option(a,(mtree_option **)pmVar29,(char *)pmVar7,len);
      pmVar7 = local_100;
      if (uVar3 != 0) goto LAB_0045c609;
    }
    local_f8 = local_e8;
LAB_0045bfec:
    local_118 = local_118 + 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) goto LAB_0045c46d;
    goto LAB_0045be8c;
  }
LAB_0045c699:
  piVar8 = __errno_location();
  iVar6 = *piVar8;
  pcVar18 = "Can\'t allocate memory";
LAB_0045c632:
  archive_set_error(&a->archive,iVar6,pcVar18);
LAB_0045c639:
  uVar22 = 0xffffffe2;
LAB_0045c63f:
  free_options((mtree_option *)local_110);
  goto LAB_0045c649;
LAB_0045c609:
  uVar22 = (ulong)uVar3;
  goto LAB_0045c63f;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}